

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

Path * __thiscall
RuntimeObjectSystem::FindFile
          (Path *__return_storage_ptr__,RuntimeObjectSystem *this,Path *input,bool *pFound)

{
  string *psVar1;
  TFileMap *this_00;
  pointer pcVar2;
  ICompilerLogger *pIVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  char *__s;
  long lVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  char cVar12;
  bool bVar13;
  bool bVar14;
  Path currPath;
  Path requestedDirectory;
  Path currPath_1;
  Path directory;
  Path *foundFile;
  Path checkFromCurrentDir;
  TFileList requestedSubPaths;
  Path directory_1;
  Path existingPath;
  Path filename;
  Path toCheck;
  undefined1 local_250 [144];
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Base_ptr local_198;
  _Base_ptr local_190;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  char *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  Path *local_138;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  char *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> local_108;
  string *local_e8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Path local_68;
  bool *local_40;
  TFileMap *local_38;
  
  local_e8 = &input->m_string;
  if ((input->m_string)._M_string_length == 0) {
    bVar14 = true;
  }
  else {
    bVar14 = *(local_e8->_M_dataplus)._M_p != '/';
  }
  local_1c0 = (undefined1  [8])&PTR__Path_001198d8;
  local_1b8._M_p = (pointer)&local_1a8;
  pcVar2 = (input->m_string)._M_dataplus._M_p;
  local_138 = __return_storage_ptr__;
  local_40 = pFound;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar2,pcVar2 + (input->m_string)._M_string_length);
  local_88._M_p = (pointer)&local_78;
  local_90 = (undefined1  [8])&PTR__Path_001198d8;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_138->_vptr_Path = (_func_int **)&PTR__Path_001198d8;
  psVar1 = &local_138->m_string;
  (local_138->m_string)._M_dataplus._M_p = (pointer)&(local_138->m_string).field_2;
  pcVar2 = (input->m_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + (input->m_string)._M_string_length);
  cVar12 = (char)local_e8;
  uVar6 = std::__cxx11::string::rfind(cVar12,0x2e);
  if (((uVar6 != 0xffffffffffffffff) &&
      (uVar7 = std::__cxx11::string::rfind(cVar12,0x2f),
      uVar7 == 0xffffffffffffffff || uVar7 <= uVar6)) &&
     (uVar7 = std::__cxx11::string::rfind(cVar12,0x5c),
     uVar7 == 0xffffffffffffffff || uVar7 <= uVar6)) {
    FileSystemUtils::Path::ParentPath((Path *)local_250,(Path *)local_1c0);
    std::__cxx11::string::_M_assign((string *)&local_1b8);
    local_250._0_8_ = &PTR__Path_001198d8;
    if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
      operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
    }
    FileSystemUtils::Path::Filename((Path *)local_250,input);
    std::__cxx11::string::_M_assign((string *)&local_88);
    local_250._0_8_ = &PTR__Path_001198d8;
    if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
      operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
    }
  }
  if (bVar14) {
    local_250._0_8_ = &PTR__Path_001198d8;
    pcVar2 = local_250 + 0x18;
    local_250._16_8_ = (char *)0x0;
    local_250[0x18] = '\0';
    local_250._8_8_ = pcVar2;
    pcVar8 = getcwd((char *)0x0,0);
    uVar4 = local_250._16_8_;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)(local_250 + 8),0,(char *)uVar4,(ulong)pcVar8);
    free(pcVar8);
    FileSystemUtils::operator/((Path *)local_130,(Path *)local_250,input);
    local_250._0_8_ = &PTR__Path_001198d8;
    if ((pointer)local_250._8_8_ != pcVar2) {
      operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
    }
    iVar5 = stat(local_128._M_p,(stat *)local_250);
    if (iVar5 == 0) {
      std::__cxx11::string::_M_assign((string *)psVar1);
      local_188 = (undefined1  [8])&PTR__Path_001198d8;
      local_178 = (char *)0x0;
      local_170._M_local_buf[0] = '\0';
      local_180._M_p = (pointer)&local_170;
      __s = getcwd((char *)0x0,0);
      pcVar8 = local_178;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_180,0,pcVar8,(ulong)__s);
      free(__s);
      FileSystemUtils::operator/((Path *)local_250,(Path *)local_188,(Path *)local_1c0);
      std::__cxx11::string::_M_assign((string *)&local_1b8);
      local_250._0_8_ = &PTR__Path_001198d8;
      if ((pointer)local_250._8_8_ != pcVar2) {
        operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
      }
      local_188 = (undefined1  [8])&PTR__Path_001198d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,
                        CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) +
                        1);
      }
    }
    local_130 = (undefined1  [8])&PTR__Path_001198d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_p != &local_118) {
      operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
    }
  }
  iVar5 = stat(local_1b8._M_p,(stat *)local_250);
  this_00 = &this->m_FoundSourceDirectoryMappings;
  if (iVar5 == 0) {
    pmVar11 = std::
              map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
              ::operator[](this_00,(key_type *)local_1c0);
    std::__cxx11::string::_M_assign((string *)&pmVar11->m_string);
    goto LAB_0010ef01;
  }
  if ((this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  goto LAB_0010ef01;
  local_130 = (undefined1  [8])&PTR__Path_001198d8;
  local_128._M_p = (pointer)&local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_1b8._M_p,local_1b8._M_p + local_1b0);
  local_188 = (undefined1  [8])&PTR__Path_001198d8;
  local_180._M_p = (pointer)&local_170;
  local_178 = (char *)0x0;
  local_170._M_local_buf[0] = '\0';
  local_190 = &(this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar5 = 0;
  bVar14 = false;
  do {
    cVar12 = (char)(string *)&local_128;
    lVar9 = std::__cxx11::string::rfind(cVar12,0x2f);
    if ((0xfffffffffffffffd < lVar9 - 1U) &&
       (lVar9 = std::__cxx11::string::rfind(cVar12,0x5c), 0xfffffffffffffffd < lVar9 - 1U)) break;
    iVar10 = std::
             _Rb_tree<FileSystemUtils::Path,_std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>,_std::_Select1st<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
             ::find(&this_00->_M_t,(key_type *)local_130);
    if (iVar10._M_node == local_190) {
      FileSystemUtils::Path::ParentPath((Path *)local_250,(Path *)local_130);
      std::__cxx11::string::_M_assign((string *)&local_128);
      local_250._0_8_ = &PTR__Path_001198d8;
      if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
        operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
      }
      iVar5 = iVar5 + 1;
    }
    else {
      bVar14 = true;
      std::__cxx11::string::_M_assign((string *)&local_180);
    }
  } while (iVar10._M_node == local_190);
  if (bVar14) {
    if (iVar5 == 0) {
      FileSystemUtils::operator/((Path *)local_250,(Path *)local_188,(Path *)local_90);
      std::__cxx11::string::_M_assign((string *)psVar1);
      local_250._0_8_ = &PTR__Path_001198d8;
      if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
        operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
      }
      bVar14 = true;
    }
    else {
      local_160 = (undefined1  [8])&PTR__Path_001198d8;
      local_158._M_p = (pointer)&local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_1b8._M_p,local_1b8._M_p + local_1b0);
      std::__cxx11::string::replace((ulong)&local_158,0,local_120,(ulong)local_180._M_p);
      iVar5 = stat(local_158._M_p,(stat *)local_250);
      if (iVar5 == 0) {
        FileSystemUtils::operator/((Path *)local_250,(Path *)local_160,(Path *)local_90);
        std::__cxx11::string::_M_assign((string *)psVar1);
        local_250._0_8_ = &PTR__Path_001198d8;
        if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
          operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
        }
        iVar5 = stat((psVar1->_M_dataplus)._M_p,(stat *)local_250);
        if (iVar5 != 0) goto LAB_0010e91f;
        pmVar11 = std::
                  map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                  ::operator[](this_00,(key_type *)local_1c0);
        std::__cxx11::string::_M_assign((string *)&pmVar11->m_string);
        pIVar3 = this->m_pCompilerLogger;
        bVar14 = true;
        if (pIVar3 != (ICompilerLogger *)0x0) {
          (**(code **)(*(long *)pIVar3 + 0x10))
                    (pIVar3,"Found Directory Mapping: %s to %s\n",local_1b8._M_p,local_158._M_p);
        }
      }
      else {
LAB_0010e91f:
        bVar14 = false;
      }
      local_160 = (undefined1  [8])&PTR__Path_001198d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_p != &local_148) {
        operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
      }
    }
  }
  else {
    bVar14 = false;
  }
  if (!bVar14) {
    local_108.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160 = (undefined1  [8])&PTR__Path_001198d8;
    local_158._M_p = (pointer)&local_148;
    local_38 = this_00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_1b8._M_p,local_1b8._M_p + local_1b0);
    while( true ) {
      cVar12 = (char)(string *)&local_158;
      lVar9 = std::__cxx11::string::rfind(cVar12,0x2f);
      if ((0xfffffffffffffffd < lVar9 - 1U) &&
         (lVar9 = std::__cxx11::string::rfind(cVar12,0x5c), 0xfffffffffffffffd < lVar9 - 1U)) break;
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::push_back
                (&local_108,(value_type *)local_160);
      FileSystemUtils::Path::ParentPath((Path *)local_250,(value_type *)local_160);
      std::__cxx11::string::_M_assign((string *)&local_158);
      local_250._0_8_ = &PTR__Path_001198d8;
      if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
        operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
      }
    }
    local_198 = (this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
    if (local_198 != local_190 && !bVar14) {
      do {
        local_b8 = (undefined1  [8])&PTR__Path_001198d8;
        local_b0[0]._M_p = (pointer)&local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,local_198[2]._M_left,
                   (long)&(local_198[2]._M_left)->_M_color +
                   (long)&(local_198[2]._M_right)->_M_color);
        while( true ) {
          lVar9 = std::__cxx11::string::rfind((char)local_b0,0x2f);
          if (lVar9 - 1U < 0xfffffffffffffffe) {
            bVar13 = false;
          }
          else {
            lVar9 = std::__cxx11::string::rfind((char)local_b0,0x5c);
            bVar13 = lVar9 + 1U < 2;
          }
          if ((bVar13) || (bVar14)) break;
          if (local_108.
              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_108.
              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar9 = 0;
            uVar6 = 0;
            do {
              FileSystemUtils::Path::Filename
                        ((Path *)local_250,
                         (Path *)((long)&(local_108.
                                          super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_Path +
                                 lVar9));
              FileSystemUtils::operator/(&local_68,(Path *)local_b8,(Path *)local_250);
              local_250._0_8_ = &PTR__Path_001198d8;
              if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
                operator_delete((void *)local_250._8_8_,
                                CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
              }
              iVar5 = stat(local_68.m_string._M_dataplus._M_p,(stat *)local_250);
              bVar13 = true;
              if (iVar5 == 0) {
                local_e0 = (undefined1  [8])&PTR__Path_001198d8;
                local_d8._M_p = (pointer)&local_c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,local_1b8._M_p,local_1b8._M_p + local_1b0);
                std::__cxx11::string::replace
                          ((ulong)&local_d8,0,
                           *(char **)((long)&((local_108.
                                               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_string)
                                             ._M_string_length + lVar9),
                           (ulong)local_68.m_string._M_dataplus._M_p);
                iVar5 = stat(local_d8._M_p,(stat *)local_250);
                bVar13 = true;
                if (iVar5 == 0) {
                  FileSystemUtils::operator/((Path *)local_250,(Path *)local_e0,(Path *)local_90);
                  std::__cxx11::string::_M_assign((string *)psVar1);
                  local_250._0_8_ = &PTR__Path_001198d8;
                  if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
                    operator_delete((void *)local_250._8_8_,
                                    CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
                  }
                  iVar5 = stat((psVar1->_M_dataplus)._M_p,(stat *)local_250);
                  if (iVar5 == 0) {
                    pmVar11 = std::
                              map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                              ::operator[](local_38,(key_type *)local_1c0);
                    std::__cxx11::string::_M_assign((string *)&pmVar11->m_string);
                    pIVar3 = this->m_pCompilerLogger;
                    bVar14 = true;
                    if (pIVar3 == (ICompilerLogger *)0x0) {
                      bVar13 = false;
                    }
                    else {
                      bVar13 = false;
                      (**(code **)(*(long *)pIVar3 + 0x10))
                                (pIVar3,"Found Directory Mapping: %s to %s\n",local_1b8._M_p,
                                 local_d8._M_p);
                    }
                  }
                }
                local_e0 = (undefined1  [8])&PTR__Path_001198d8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_p != &local_c8) {
                  operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
                }
              }
              local_68._vptr_Path = (_func_int **)&PTR__Path_001198d8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68.m_string._M_dataplus._M_p != &local_68.m_string.field_2) {
                operator_delete(local_68.m_string._M_dataplus._M_p,
                                local_68.m_string.field_2._M_allocated_capacity + 1);
              }
              if (!bVar13) break;
              uVar6 = uVar6 + 1;
              lVar9 = lVar9 + 0x28;
            } while (uVar6 < (ulong)(((long)local_108.
                                            super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_108.
                                            super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x3333333333333333));
          }
          FileSystemUtils::Path::ParentPath((Path *)local_250,(Path *)local_b8);
          std::__cxx11::string::_M_assign((string *)local_b0);
          local_250._0_8_ = &PTR__Path_001198d8;
          if ((undefined1 *)local_250._8_8_ != local_250 + 0x18) {
            operator_delete((void *)local_250._8_8_,CONCAT71(local_250._25_7_,local_250[0x18]) + 1);
          }
        }
        local_198 = (_Base_ptr)std::_Rb_tree_increment(local_198);
        local_b8 = (undefined1  [8])&PTR__Path_001198d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0[0]._M_p != &local_a0) {
          operator_delete(local_b0[0]._M_p,local_a0._M_allocated_capacity + 1);
        }
      } while ((local_198 != local_190) && (!bVar14));
    }
    local_160 = (undefined1  [8])&PTR__Path_001198d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != &local_148) {
      operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
    }
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector(&local_108);
  }
  local_188 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,
                    CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1);
  }
  local_130 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
  }
LAB_0010ef01:
  iVar5 = stat((psVar1->_M_dataplus)._M_p,(stat *)local_250);
  if (local_40 != (bool *)0x0) {
    *local_40 = iVar5 == 0;
  }
  if ((iVar5 != 0) && (pIVar3 = this->m_pCompilerLogger, pIVar3 != (ICompilerLogger *)0x0)) {
    (**(code **)(*(long *)pIVar3 + 8))
              (pIVar3,"Could not find Directory Mapping for: %s\n",(local_e8->_M_dataplus)._M_p);
  }
  local_90 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  local_1c0 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  return local_138;
}

Assistant:

FileSystemUtils::Path RuntimeObjectSystem::FindFile( const FileSystemUtils::Path& input, bool* pFound )
{
    // we want absolute paths, but path might be relative - do a quick check:
    bool bMaybeRelative = true;
    #ifdef _WIN32
        // Note: C:MyDir is actually a relative path but we do not handle these as unlikely to be produced by __FILE__ input
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '\\' )
            {
                bMaybeRelative = false;
            }
            else if( input.m_string.size() >= 2 && input.m_string[1] == ':' )
            {
                bMaybeRelative = false;
            }
        }
    #else
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '/' )
            {
                bMaybeRelative = false;
            }
        }
    #endif


    FileSystemUtils::Path requestedDirectory = input;
    FileSystemUtils::Path filename;
    FileSystemUtils::Path foundFile = input;
    bool bIsFile = input.HasExtension();
    if( bIsFile )
    {
        requestedDirectory = requestedDirectory.ParentPath();
        filename = input.Filename();
    }

    if( bMaybeRelative )
    {
        // Test with input path as it might be just a file name, leading to empty requestedDirectory
        // which would always match current dir.
        FileSystemUtils::Path checkFromCurrentDir = FileSystemUtils::GetCurrentPath() / input;
        if( checkFromCurrentDir.Exists() )
        {
            foundFile = checkFromCurrentDir;
            requestedDirectory = FileSystemUtils::GetCurrentPath() / requestedDirectory;
        }
    }

    requestedDirectory.ToOSCanonicalCase();
    filename.ToOSCanonicalCase();
    foundFile.ToOSCanonicalCase();

    // Step 1: Try input directory
    if( requestedDirectory.Exists() )
    {
        m_FoundSourceDirectoryMappings[ requestedDirectory ] = requestedDirectory;
    }
    else
    {
        // Step 2: Attempt to find a pre-existing mapping
        bool bFoundMapping = false;
        if( m_FoundSourceDirectoryMappings.size() )
        {
            FileSystemUtils::Path testDir = requestedDirectory;
            FileSystemUtils::Path foundDir;
            unsigned int depth = 0;
            bool bFound = false;
            while( testDir.HasParentPath() )
            {
                TFileMapIterator itrFind = m_FoundSourceDirectoryMappings.find( testDir );
                if( itrFind != m_FoundSourceDirectoryMappings.end() )
                {
                    foundDir = itrFind->second;
                    bFound = true;
                    break;
                }

                testDir = testDir.ParentPath();
                ++depth;
            }

            if( bFound )
            {
                if( depth )
                {
                    // not an exact match
                    FileSystemUtils::Path directory = requestedDirectory;
                    directory.m_string.replace( 0, testDir.m_string.length(), foundDir.m_string );
                    if( directory.Exists() )
                    {
                        foundFile = directory / filename;
                        if( foundFile.Exists() )
                        {
                            m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                            if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                            bFoundMapping = true;
                        }
                    }

                }
                else
                {
                    // exact match
                    foundFile = foundDir / filename;
                    bFoundMapping = true;
                }
            }
            
            if( !bFoundMapping )
            {
                // Step 3: Attempt to find a mapping from a known path
                TFileList requestedSubPaths;
                FileSystemUtils::Path requestedSubPath = requestedDirectory;
                while( requestedSubPath.HasParentPath() )
                {
                    requestedSubPaths.push_back( requestedSubPath );
                    requestedSubPath = requestedSubPath.ParentPath();
                }

                TFileMapIterator itr = m_FoundSourceDirectoryMappings.begin();
                while( ( itr != m_FoundSourceDirectoryMappings.end() ) && !bFoundMapping )
                {
                    FileSystemUtils::Path existingPath = itr->second;
                    while( ( existingPath.HasParentPath() ) && !bFoundMapping )
                    {
                        // check all potentials
                        for( size_t i=0; i<requestedSubPaths.size(); ++i )
                        {
                            FileSystemUtils::Path toCheck = existingPath / requestedSubPaths[i].Filename();
                            if( toCheck.Exists() )
                            {
                                // potential mapping
                                FileSystemUtils::Path directory = requestedDirectory;
                                directory.m_string.replace( 0, requestedSubPaths[i].m_string.length(), toCheck.m_string );
                                if( directory.Exists() )
                                {
                                    foundFile = directory / filename;
                                    if( foundFile.Exists() )
                                    {
                                        m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                                        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                                        bFoundMapping = true;
                                        break;
                                    }
                                }
                            }
                        }
                        existingPath = existingPath.ParentPath();
                    }
                    ++itr;
                }
            }
        }

        foundFile.ToOSCanonicalCase();
    }

    bool bFound = foundFile.Exists();
    if( pFound )
    {
        *pFound = bFound;
    }
    if( !bFound )
    {
        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogWarning( "Could not find Directory Mapping for: %s\n", input.c_str() ); }
    }
    return foundFile;
}